

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void array_container_append(array_container_t *arr,uint16_t pos)

{
  int iVar1;
  _Bool _Var2;
  uint16_t in_SI;
  array_container_t *in_RDI;
  array_container_t *unaff_retaddr;
  int32_t capacity;
  
  _Var2 = array_container_full(in_RDI);
  if (_Var2) {
    array_container_grow
              (unaff_retaddr,(int32_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  }
  iVar1 = in_RDI->cardinality;
  in_RDI->cardinality = iVar1 + 1;
  in_RDI->array[iVar1] = in_SI;
  return;
}

Assistant:

static inline void array_container_append(array_container_t *arr,
                                          uint16_t pos) {
    const int32_t capacity = arr->capacity;

    if (array_container_full(arr)) {
        array_container_grow(arr, capacity + 1, true);
    }

    arr->array[arr->cardinality++] = pos;
}